

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O1

int PrepareNextRun(SUNContext sunctx,void *cvode_mem,int lmm,int miter,N_Vector y,SUNMatrix *A,
                  sunindextype mu,sunindextype ml,SUNLinearSolver *LS,SUNNonlinearSolver *NLS)

{
  uint uVar1;
  SUNLinearSolver p_Var2;
  SUNMatrix p_Var3;
  long lVar4;
  ulong uVar5;
  code *pcVar6;
  char *pcVar7;
  
  if (*LS != (SUNLinearSolver)0x0) {
    SUNNonlinSolFree();
  }
  if (*(long *)ml != 0) {
    SUNLinSolFree();
  }
  if (*A != (SUNMatrix)0x0) {
    SUNMatDestroy();
  }
  printf("\n\n-------------------------------------------------------------");
  printf("\n\nLinear Multistep Method : ");
  pcVar7 = "BDF";
  if (lmm == 1) {
    pcVar7 = "ADAMS";
  }
  puts(pcVar7);
  printf("Iteration               : ");
  if (miter == 0) {
    puts("FIXEDPOINT");
    p_Var2 = (SUNLinearSolver)SUNNonlinSol_FixedPoint(y,0,sunctx);
    *LS = p_Var2;
    if (p_Var2 == (SUNLinearSolver)0x0) {
      PrepareNextRun_cold_9();
      goto LAB_0010380c;
    }
    uVar1 = CVodeSetNonlinearSolver(cvode_mem,*LS);
    if (-1 < (int)uVar1) {
      return uVar1;
    }
LAB_0010366a:
    uVar5 = (ulong)uVar1;
    pcVar7 = "CVodeSetNonlinearSolver";
LAB_00103805:
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar7,uVar5);
  }
  else {
    puts("NEWTON");
    p_Var2 = (SUNLinearSolver)SUNNonlinSol_Newton(y,sunctx);
    *LS = p_Var2;
    uVar1 = CVodeSetNonlinearSolver(cvode_mem,p_Var2);
    if ((int)uVar1 < 0) goto LAB_0010366a;
    printf("Linear Solver           : ");
    switch(miter) {
    case 1:
      puts("Dense, User-Supplied Jacobian");
      p_Var3 = (SUNMatrix)SUNDenseMatrix(2,2,sunctx);
      *A = p_Var3;
      if (p_Var3 == (SUNMatrix)0x0) {
        PrepareNextRun_cold_8();
      }
      else {
        lVar4 = SUNLinSol_Dense(y,*A,sunctx);
        *(long *)ml = lVar4;
        if (lVar4 != 0) {
          uVar1 = CVodeSetLinearSolver(cvode_mem,*(undefined8 *)ml,*A);
          if (-1 < (int)uVar1) {
            pcVar6 = Jac1;
            goto LAB_001037e0;
          }
LAB_00103829:
          pcVar7 = "CVodeSetLinearSolver";
          uVar5 = (ulong)uVar1;
          goto LAB_00103805;
        }
        PrepareNextRun_cold_7();
      }
      break;
    case 2:
      puts("Dense, Difference Quotient Jacobian");
      p_Var3 = (SUNMatrix)SUNDenseMatrix(2,2,sunctx);
      *A = p_Var3;
      if (p_Var3 == (SUNMatrix)0x0) {
        PrepareNextRun_cold_6();
      }
      else {
        lVar4 = SUNLinSol_Dense(y,*A,sunctx);
        *(long *)ml = lVar4;
        if (lVar4 != 0) {
LAB_001037c9:
          uVar1 = CVodeSetLinearSolver(cvode_mem,*(undefined8 *)ml,*A);
          if ((int)uVar1 < 0) goto LAB_00103829;
          pcVar6 = (code *)0x0;
LAB_001037e0:
          uVar1 = CVodeSetJacFn(cvode_mem,pcVar6);
          uVar5 = (ulong)uVar1;
          if (-1 < (int)uVar1) {
            return uVar1;
          }
          pcVar7 = "CVodeSetJacFn";
          goto LAB_00103805;
        }
        PrepareNextRun_cold_5();
      }
      break;
    case 3:
      puts("Diagonal Jacobian");
      uVar1 = CVDiag(cvode_mem);
      uVar5 = (ulong)uVar1;
      if (-1 < (int)uVar1) {
        return uVar1;
      }
      pcVar7 = "CVDiag";
      goto LAB_00103805;
    case 4:
      puts("Band, User-Supplied Jacobian");
      p_Var3 = (SUNMatrix)SUNBandMatrix(0x19,0,mu,sunctx);
      *A = p_Var3;
      if (p_Var3 == (SUNMatrix)0x0) {
        PrepareNextRun_cold_4();
      }
      else {
        lVar4 = SUNLinSol_Band(y,*A,sunctx);
        *(long *)ml = lVar4;
        if (lVar4 != 0) {
          uVar1 = CVodeSetLinearSolver(cvode_mem,*(undefined8 *)ml,*A);
          if ((int)uVar1 < 0) goto LAB_00103829;
          pcVar6 = Jac2;
          goto LAB_001037e0;
        }
        PrepareNextRun_cold_3();
      }
      break;
    case 5:
      puts("Band, Difference Quotient Jacobian");
      p_Var3 = (SUNMatrix)SUNBandMatrix(0x19,0,mu,sunctx);
      *A = p_Var3;
      if (p_Var3 == (SUNMatrix)0x0) {
        PrepareNextRun_cold_2();
      }
      else {
        lVar4 = SUNLinSol_Band(y,*A,sunctx);
        *(long *)ml = lVar4;
        if (lVar4 != 0) goto LAB_001037c9;
        PrepareNextRun_cold_1();
      }
      break;
    default:
      goto switchD_001035c2_default;
    }
  }
LAB_0010380c:
  uVar1 = 1;
switchD_001035c2_default:
  return uVar1;
}

Assistant:

static int PrepareNextRun(SUNContext sunctx, void* cvode_mem, int lmm,
                          int miter, N_Vector y, SUNMatrix* A, sunindextype mu,
                          sunindextype ml, SUNLinearSolver* LS,
                          SUNNonlinearSolver* NLS)
{
  int retval = CV_SUCCESS;

  if (*NLS) { SUNNonlinSolFree(*NLS); }
  if (*LS) { SUNLinSolFree(*LS); }
  if (*A) { SUNMatDestroy(*A); }

  printf("\n\n-------------------------------------------------------------");

  printf("\n\nLinear Multistep Method : ");
  if (lmm == CV_ADAMS) { printf("ADAMS\n"); }
  else { printf("BDF\n"); }

  printf("Iteration               : ");
  if (miter == FUNC)
  {
    printf("FIXEDPOINT\n");

    /* create fixed point nonlinear solver object */
    *NLS = SUNNonlinSol_FixedPoint(y, 0, sunctx);
    if (check_retval((void*)*NLS, "SUNNonlinSol_FixedPoint", 0)) { return (1); }

    /* attach nonlinear solver object to CVode */
    retval = CVodeSetNonlinearSolver(cvode_mem, *NLS);
    if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }
  }
  else
  {
    printf("NEWTON\n");

    /* create Newton nonlinear solver object */
    *NLS = SUNNonlinSol_Newton(y, sunctx);
    if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

    /* attach nonlinear solver object to CVode */
    retval = CVodeSetNonlinearSolver(cvode_mem, *NLS);
    if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

    printf("Linear Solver           : ");

    switch (miter)
    {
    case DENSE_USER:
      printf("Dense, User-Supplied Jacobian\n");

      /* Create dense SUNMatrix for use in linear solves */
      *A = SUNDenseMatrix(P1_NEQ, P1_NEQ, sunctx);
      if (check_retval((void*)*A, "SUNDenseMatrix", 0)) { return (1); }

      /* Create dense SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Dense(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Dense", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Set the user-supplied Jacobian routine Jac */
      retval = CVodeSetJacFn(cvode_mem, Jac1);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case DENSE_DQ:
      printf("Dense, Difference Quotient Jacobian\n");

      /* Create dense SUNMatrix for use in linear solves */
      *A = SUNDenseMatrix(P1_NEQ, P1_NEQ, sunctx);
      if (check_retval((void*)*A, "SUNDenseMatrix", 0)) { return (1); }

      /* Create dense SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Dense(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Dense", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Use a difference quotient Jacobian */
      retval = CVodeSetJacFn(cvode_mem, NULL);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case DIAG:
      printf("Diagonal Jacobian\n");

      /* Call CVDiag to create/attach the CVODE-specific diagonal solver */
      retval = CVDiag(cvode_mem);
      if (check_retval(&retval, "CVDiag", 1)) { return (1); }
      break;

    case BAND_USER:
      printf("Band, User-Supplied Jacobian\n");

      /* Create band SUNMatrix for use in linear solves */
      *A = SUNBandMatrix(P2_NEQ, mu, ml, sunctx);
      if (check_retval((void*)*A, "SUNBandMatrix", 0)) { return (1); }

      /* Create banded SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Band(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Band", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Set the user-supplied Jacobian routine Jac */
      retval = CVodeSetJacFn(cvode_mem, Jac2);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case BAND_DQ:
      printf("Band, Difference Quotient Jacobian\n");

      /* Create band SUNMatrix for use in linear solves */
      *A = SUNBandMatrix(P2_NEQ, mu, ml, sunctx);
      if (check_retval((void*)*A, "SUNBandMatrix", 0)) { return (1); }

      /* Create banded SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Band(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Band", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Use a difference quotient Jacobian */
      retval = CVodeSetJacFn(cvode_mem, NULL);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;
    }
  }

  return (retval);
}